

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G2.c
# Opt level: O2

int G2_to_bin(uint8_t *s,G2 *Q,ATE_CTX *ctx)

{
  G2 tmp;
  
  G2_copy(&tmp,Q);
  G2_makeaffine(&tmp,ctx);
  fp2_to_bin(s,tmp.m_x,ctx);
  fp2_to_bin(s + 0x40,tmp.m_y,ctx);
  return 1;
}

Assistant:

int G2_to_bin(uint8_t s[4*N_BYTES], const G2 *Q, const ATE_CTX *ctx)
{
    G2 tmp;
    G2_copy(&tmp, Q);
    G2_makeaffine(&tmp, ctx);
    fp2_to_bin(s, tmp.m_x, ctx);
    fp2_to_bin(s + 2*N_BYTES, tmp.m_y, ctx);
    return GML_OK;
}